

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_pool32axf_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *s;
  TCGv_ptr pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  long lVar5;
  int iVar6;
  uintptr_t o;
  uint uVar7;
  uint32_t uVar8;
  uintptr_t o_49;
  uintptr_t o_97;
  TCGv_i64 pTVar9;
  uintptr_t o_18;
  TCGv_i64 pTVar10;
  TCGOpcode TVar11;
  code *pcVar12;
  TCGContext_conflict6 *pTVar13;
  uint from;
  uintptr_t o_27;
  ulong uVar14;
  uintptr_t o_3;
  uint to;
  uintptr_t o_28;
  TCGv_i64 pTVar15;
  uint uVar16;
  uintptr_t o_1;
  TCGv_i64 pTVar17;
  uintptr_t o_72;
  TCGTemp *args [1];
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGv_ptr local_50;
  DisasContext_conflict6 *local_40;
  undefined8 local_38;
  ulong a2;
  
  uVar16 = ctx->opcode;
  uVar2 = uVar16 >> 6 & 7;
  if (6 < uVar2 - 1) {
switchD_009862e5_caseD_3:
    generate_exception_err(ctx,0x14,0);
    return;
  }
  s = ctx->uc->tcg_ctx;
  to = uVar16 >> 0x15 & 0x1f;
  from = uVar16 >> 0x10 & 0x1f;
  a2 = (ulong)from;
  uVar7 = uVar16 >> 0xb & 0x1f;
  switch(uVar2) {
  case 1:
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)a1 - (long)s);
    if (from == 0) {
      TVar11 = INDEX_op_movi_i64;
      pTVar9 = (TCGv_i64)0x0;
LAB_00986694:
      tcg_gen_op2_mips64el(s,TVar11,(TCGArg)a1,(TCGArg)pTVar9);
    }
    else if (s->cpu_gpr[a2] != pTVar10) {
      pTVar9 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[a2]);
      TVar11 = INDEX_op_mov_i64;
      goto LAB_00986694;
    }
    break;
  case 2:
    local_38 = (TCGTemp *)(CONCAT44(local_38._4_4_,uVar16 >> 0xc) & 0xffffffff00000003);
    local_40 = ctx;
    tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    if (to == 0) {
      TVar11 = INDEX_op_movi_i64;
      pTVar10 = (TCGv_i64)0x0;
    }
    else {
      if (s->cpu_gpr[to] == (TCGv_i64)((long)pTVar3 - (long)s)) goto LAB_00986727;
      pTVar10 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[to]);
      TVar11 = INDEX_op_mov_i64;
    }
    tcg_gen_op2_mips64el(s,TVar11,(TCGArg)pTVar3,(TCGArg)pTVar10);
LAB_00986727:
    uVar14 = (ulong)local_38 & 0xffffffff;
    if (from == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
      (*(code *)(&DAT_00d9e704 + *(int *)(&DAT_00d9e704 + uVar14 * 4)))();
      return;
    }
    if (s->cpu_gpr[a2] != (TCGv_i64)((long)pTVar4 - (long)s)) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)pTVar4,
                 (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a2]));
    }
    (*(code *)(&DAT_00d9e704 + *(int *)(&DAT_00d9e704 + uVar14 * 4)))();
    return;
  default:
    goto switchD_009862e5_caseD_3;
  case 4:
    uVar16 = uVar16 >> 9 & 0x7f;
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar4 - (long)s);
    if (from == 0) {
      TVar11 = INDEX_op_movi_i64;
      pTVar9 = (TCGv_i64)0x0;
LAB_0098657f:
      tcg_gen_op2_mips64el(s,TVar11,(TCGArg)pTVar4,(TCGArg)pTVar9);
    }
    else if (s->cpu_gpr[from] != pTVar10) {
      pTVar9 = s->cpu_gpr[from] + (long)s;
      TVar11 = INDEX_op_mov_i64;
      goto LAB_0098657f;
    }
    pTVar9 = (TCGv_i64)((long)pTVar3 - (long)s);
    if (0x2f < uVar16) {
      if (0x48 < uVar16) {
        if (uVar16 < 0x68) {
          if (uVar16 == 0x49) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_13();
            }
            pcVar12 = helper_precequ_ph_qbra_mips64el;
LAB_0098752e:
            iVar6 = 1;
            goto LAB_00987536;
          }
          if (uVar16 == 0x58) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_12();
            }
            pcVar12 = helper_preceu_ph_qbl_mips64el;
LAB_00987474:
            local_68 = (TCGTemp *)((long)s + (long)pTVar10);
            tcg_gen_callN_mips64el(s,pcVar12,local_68,1,&local_68);
            goto LAB_00987481;
          }
          if (uVar16 == 0x59) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_10();
            }
            pcVar12 = helper_preceu_ph_qbla_mips64el;
            goto LAB_00986f53;
          }
        }
        else {
          if (uVar16 == 0x68) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_11();
            }
            pcVar12 = helper_preceu_ph_qbr_mips64el;
            goto LAB_0098752e;
          }
          if (uVar16 == 0x69) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_9();
            }
            pcVar12 = helper_preceu_ph_qbra_mips64el;
            goto LAB_00987474;
          }
          if (uVar16 == 0x78) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_4();
            }
            pcVar12 = helper_raddu_w_qb_mips64el;
            goto LAB_00986f53;
          }
        }
switchD_00986a46_caseD_2:
        generate_exception_err(ctx,0x14,0);
        goto LAB_00987580;
      }
      if (0x38 < uVar16) {
        if (uVar16 == 0x39) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_14();
          }
          pcVar12 = helper_precequ_ph_qbla_mips64el;
          goto LAB_00987474;
        }
        if (uVar16 == 0x3d) {
          gen_bshfl(ctx,0x7c0000a0,to,from);
          goto LAB_00987580;
        }
        if (uVar16 == 0x48) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_15();
          }
          pcVar12 = helper_precequ_ph_qbr_mips64el;
          goto LAB_00986f53;
        }
        goto switchD_00986a46_caseD_2;
      }
      if (uVar16 != 0x30) {
        if (uVar16 != 0x38) goto switchD_00986a46_caseD_2;
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_16();
        }
        pcVar12 = helper_precequ_ph_qbl_mips64el;
LAB_00986f53:
        iVar6 = 1;
        goto LAB_0098728c;
      }
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_17();
      }
      tcg_gen_andi_i64_mips64el(s,pTVar10,pTVar10,0xffff);
      tcg_gen_shli_i64_mips64el(s,pTVar10,pTVar10,0x10);
LAB_00987441:
      tcg_gen_ext32s_i64_mips64el(s,pTVar10,pTVar10);
LAB_00987481:
      if (to == 0) goto LAB_00987580;
      goto LAB_00987548;
    }
    if (0xf < uVar16) {
      if (uVar16 < 0x25) {
        if (uVar16 != 0x10) {
          if (uVar16 == 0x18) {
            if ((ctx->hflags & 0x80000) == 0) {
              gen_pool32axf_nanomips_insn_cold_6();
            }
            pcVar12 = helper_bitrev_mips64el;
            goto LAB_00987474;
          }
          if (uVar16 != 0x20) goto switchD_00986a46_caseD_2;
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_5();
          }
          pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
          if (to == 0) {
            tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
          }
          else if (s->cpu_gpr[to] != (TCGv_i64)((long)pTVar3 - (long)s)) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)pTVar3,
                       (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]));
          }
          local_68 = (TCGTemp *)(s->cpu_env + (long)s);
          local_60 = (TCGTemp *)((long)s + (long)pTVar10);
          pTVar3 = (TCGTemp *)((TCGv_i64)((long)pTVar3 - (long)s) + (long)s);
          local_58 = pTVar3;
          tcg_gen_callN_mips64el(s,helper_insv_mips64el,local_60,3,&local_68);
          if ((to != 0) && (s->cpu_gpr[to] != pTVar10)) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[to] + (long)s),(TCGArg)pTVar4);
          }
          tcg_temp_free_internal_mips64el(s,pTVar3);
          goto LAB_00987580;
        }
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_19();
        }
        local_60 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar12 = helper_absq_s_w_mips64el;
        iVar6 = 2;
LAB_00987536:
        local_68 = (TCGTemp *)((long)s + (long)pTVar10);
        tcg_gen_callN_mips64el(s,pcVar12,local_68,iVar6,&local_68);
        goto joined_r0x00987543;
      }
      if (uVar16 == 0x25) {
        if ((ctx->CP0_Config5 & 0x200000) != 0) {
          generate_exception_err(ctx,0x14,0);
        }
        pTVar13 = ctx->uc->tcg_ctx;
        uVar8 = 0x70000021;
      }
      else {
        if (uVar16 == 0x28) {
          if ((ctx->hflags & 0x80000) == 0) {
            gen_pool32axf_nanomips_insn_cold_18();
          }
          tcg_gen_andi_i64_mips64el(s,pTVar10,pTVar10,0xffff0000);
          goto LAB_00987441;
        }
        if (uVar16 != 0x2d) goto switchD_00986a46_caseD_2;
        if ((ctx->CP0_Config5 & 0x200000) != 0) {
          generate_exception_err(ctx,0x14,0);
        }
        pTVar13 = ctx->uc->tcg_ctx;
        uVar8 = 0x70000020;
      }
      gen_cl((DisasContext_conflict6 *)pTVar13,uVar8,to,from);
      goto LAB_00987580;
    }
    switch(uVar16) {
    case 0:
      if ((ctx->hflags & 0x100000) == 0) {
        gen_pool32axf_nanomips_insn_cold_21();
      }
      pTVar1 = s->cpu_env;
      pcVar12 = helper_absq_s_qb_mips64el;
      break;
    case 1:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_8();
      }
      tcg_gen_ext16u_i64_mips64el(s,pTVar10,pTVar10);
      tcg_gen_shli_i64_mips64el(s,pTVar9,pTVar10,0x10);
      goto LAB_00987313;
    default:
      goto switchD_00986a46_caseD_2;
    case 5:
      gen_bitswap((DisasContext_conflict6 *)ctx->uc->tcg_ctx,0x7c000020,to,from);
      goto LAB_00987580;
    case 8:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_20();
      }
      pTVar1 = s->cpu_env;
      pcVar12 = helper_absq_s_ph_mips64el;
      break;
    case 9:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_7();
      }
      tcg_gen_ext8u_i64_mips64el(s,pTVar10,pTVar10);
      tcg_gen_shli_i64_mips64el(s,pTVar9,pTVar10,8);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar4,(TCGArg)pTVar4,(TCGArg)pTVar3);
      tcg_gen_shli_i64_mips64el(s,pTVar9,pTVar10,0x10);
LAB_00987313:
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar4,(TCGArg)pTVar4,(TCGArg)pTVar3);
      tcg_gen_ext32s_i64_mips64el(s,pTVar10,pTVar10);
      if (to != 0) {
        pTVar17 = s->cpu_gpr[to];
        goto joined_r0x00987343;
      }
      goto LAB_00987580;
    }
    local_60 = (TCGTemp *)(pTVar1 + (long)s);
    iVar6 = 2;
LAB_0098728c:
    local_68 = (TCGTemp *)((long)s + (long)pTVar10);
    tcg_gen_callN_mips64el(s,pcVar12,local_68,iVar6,&local_68);
joined_r0x00987543:
    if (to != 0) {
LAB_00987548:
      pTVar17 = s->cpu_gpr[to];
joined_r0x00987343:
      if (pTVar17 != pTVar10) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(pTVar17 + (long)s),(TCGArg)pTVar4);
      }
    }
LAB_00987580:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar10 + (long)s));
    pTVar3 = (TCGTemp *)(pTVar9 + (long)s);
    goto LAB_0098792d;
  case 5:
    uVar16 = uVar16 >> 9 & 0x7f;
    if (0x2a < uVar16) {
      switch(uVar16) {
      case 0x70:
        gen_load_srsgpr(s,from,to);
        return;
      case 0x71:
        uVar8 = 0x4200001f;
        break;
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
        goto switchD_009862e5_caseD_3;
      case 0x78:
        gen_store_srsgpr(s,from,to);
        return;
      case 0x79:
        uVar8 = 0x42000018;
        break;
      default:
        if (uVar16 != 0x2b) {
          if (uVar16 == 0x61) {
            uVar8 = 0x42000020;
            break;
          }
          goto switchD_009862e5_caseD_3;
        }
        if ((ctx->hflags & 0x10) == 0) {
          generate_exception_err(ctx,0x13,0);
        }
        pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        save_cpu_state(ctx,1);
        pTVar1 = s->cpu_env;
        pcVar12 = helper_ei_mips64el;
        goto LAB_00987055;
      }
LAB_00986fb9:
      gen_cp0(env,ctx,uVar8,0,0);
      return;
    }
    if (uVar16 < 0xb) {
      if (uVar16 == 1) {
        uVar8 = 0x42000008;
      }
      else if (uVar16 == 3) {
        uVar8 = 0x42000003;
      }
      else {
        if (uVar16 != 9) goto switchD_009862e5_caseD_3;
        uVar8 = 0x42000001;
      }
      goto LAB_00986fb9;
    }
    if (uVar16 < 0x19) {
      if (uVar16 == 0xb) {
        uVar8 = 0x42000004;
      }
      else {
        if (uVar16 != 0x11) goto switchD_009862e5_caseD_3;
        uVar8 = 0x42000002;
      }
      goto LAB_00986fb9;
    }
    if (uVar16 == 0x19) {
      uVar8 = 0x42000006;
      goto LAB_00986fb9;
    }
    if (uVar16 != 0x23) goto switchD_009862e5_caseD_3;
    if ((ctx->hflags & 0x10) == 0) {
      generate_exception_err(ctx,0x13,0);
    }
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    save_cpu_state(ctx,1);
    pTVar1 = s->cpu_env;
    pcVar12 = helper_di_mips64el;
LAB_00987055:
    local_68 = (TCGTemp *)(pTVar1 + (long)s);
    tcg_gen_callN_mips64el(s,pcVar12,pTVar3,1,&local_68);
    if ((to != 0) && (s->cpu_gpr[to] != (TCGv_i64)((long)pTVar3 - (long)s))) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]),
                 (TCGArg)pTVar3);
    }
    (ctx->base).is_jmp = DISAS_TARGET_0;
    goto LAB_0098792d;
  case 7:
    uVar16 = uVar16 >> 9 & 7;
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar4 - (long)s);
    if (from == 0) {
      TVar11 = INDEX_op_movi_i64;
      pTVar9 = (TCGv_i64)0x0;
LAB_009867fd:
      tcg_gen_op2_mips64el(s,TVar11,(TCGArg)pTVar4,(TCGArg)pTVar9);
    }
    else if (s->cpu_gpr[a2] != pTVar10) {
      pTVar9 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[a2]);
      TVar11 = INDEX_op_mov_i64;
      goto LAB_009867fd;
    }
    pTVar9 = (TCGv_i64)((long)pTVar3 - (long)s);
    if (uVar16 == 2) {
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_1();
      }
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)pTVar3,
                 (long)(int)((ctx->opcode >> 0xd & 0xff) * 0x1010101));
LAB_00986ede:
      if ((to != 0) && (s->cpu_gpr[to] != pTVar9)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[to]),
                   (TCGArg)pTVar3);
      }
    }
    else {
      if (uVar16 == 1) {
        if ((ctx->hflags & 0x100000) == 0) {
          gen_pool32axf_nanomips_insn_cold_2();
        }
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 1));
        pcVar12 = helper_shrl_ph_mips64el;
LAB_00986ed4:
        local_60 = (TCGTemp *)((long)s + (long)pTVar10);
        local_68 = (TCGTemp *)((long)s + (long)pTVar9);
        tcg_gen_callN_mips64el(s,pcVar12,local_68,2,&local_68);
        goto LAB_00986ede;
      }
      if (uVar16 == 0) {
        if ((ctx->hflags & 0x100000) == 0) {
          gen_pool32axf_nanomips_insn_cold_3();
        }
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 2));
        if ((ctx->opcode & 0x1000) == 0) {
          pcVar12 = helper_shra_qb_mips64el;
        }
        else {
          pcVar12 = helper_shra_r_qb_mips64el;
        }
        goto LAB_00986ed4;
      }
      generate_exception_err(ctx,0x14,0);
    }
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar9 + (long)s));
    goto LAB_0098792a;
  }
  pTVar9 = (TCGv_i64)((long)pTVar3 - (long)s);
  lVar5 = (long)pTVar4 - (long)s;
  switch(uVar16 >> 9 & 7) {
  case 0:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_37();
    }
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      uVar8 = 0x10;
      break;
    case 1:
      uVar8 = 0x12;
      break;
    case 2:
      uVar8 = 0x11;
      to = from;
      break;
    case 3:
      uVar8 = 0x13;
      to = from;
    }
    gen_HILO(ctx,uVar8,uVar7 >> 3,to);
    break;
  case 1:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_36();
    }
    uVar16 = ctx->opcode >> 0xc & 3;
    if (uVar16 == 1) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 3));
      pTVar1 = s->cpu_env;
      pcVar12 = helper_shilo_mips64el;
    }
    else {
      if (uVar16 != 0) {
        generate_exception_err(ctx,0x14,0);
        break;
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)uVar7);
      pTVar1 = s->cpu_env;
      pcVar12 = helper_mthlip_mips64el;
    }
    local_58 = (TCGTemp *)(pTVar1 + (long)s);
    local_60 = (TCGTemp *)((long)s + (long)pTVar10);
    local_68 = (TCGTemp *)((long)s + (long)pTVar9);
    tcg_gen_callN_mips64el(s,pcVar12,(TCGTemp *)0x0,3,&local_68);
    break;
  default:
    generate_exception_err(ctx,0x14,0);
    break;
  case 3:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_35();
    }
    uVar16 = ctx->opcode >> 0xe & 0x7f;
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)uVar16);
      local_60 = (TCGTemp *)(s->cpu_env + (long)s);
      local_68 = (TCGTemp *)((long)s + (long)pTVar9);
      tcg_gen_callN_mips64el(s,helper_rddsp_mips64el,local_68,2,&local_68);
      if (to == 0) goto LAB_00987908;
      pTVar17 = s->cpu_gpr[to];
      goto LAB_00987772;
    case 1:
      if (to == 0) {
        TVar11 = INDEX_op_movi_i64;
        pTVar17 = (TCGv_i64)0x0;
LAB_00987f9b:
        tcg_gen_op2_mips64el(s,TVar11,(TCGArg)pTVar3,(TCGArg)pTVar17);
      }
      else if (s->cpu_gpr[to] != pTVar9) {
        pTVar17 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[to]);
        TVar11 = INDEX_op_mov_i64;
        goto LAB_00987f9b;
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,(ulong)uVar16);
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      local_68 = (TCGTemp *)((long)s + (long)pTVar9);
      local_60 = (TCGTemp *)((long)s + lVar5);
      tcg_gen_callN_mips64el(s,helper_wrdsp_mips64el,(TCGTemp *)0x0,3,&local_68);
      goto LAB_00987908;
    case 2:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 3));
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,a2);
      pTVar1 = s->cpu_env;
      pcVar12 = helper_extp_mips64el;
      break;
    case 3:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 3));
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,a2);
      pTVar1 = s->cpu_env;
      pcVar12 = helper_extpdp_mips64el;
    }
    local_58 = (TCGTemp *)(pTVar1 + (long)s);
    local_60 = (TCGTemp *)((long)s + lVar5);
    local_68 = (TCGTemp *)((long)s + (long)pTVar9);
    tcg_gen_callN_mips64el(s,pcVar12,local_68,3,&local_68);
    goto joined_r0x00987761;
  case 4:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_34();
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 2));
    if ((ctx->opcode & 0x1000) == 0) {
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar12 = helper_shll_qb_mips64el;
      iVar6 = 3;
    }
    else {
      pcVar12 = helper_shrl_qb_mips64el;
      iVar6 = 2;
    }
    local_60 = (TCGTemp *)((long)s + (long)pTVar10);
    local_68 = (TCGTemp *)((long)s + (long)pTVar9);
    tcg_gen_callN_mips64el(s,pcVar12,local_68,iVar6,&local_68);
    if (to == 0) break;
    goto LAB_0098776a;
  case 5:
    uVar16 = ctx->opcode >> 0xc & 3;
    pTVar13 = ctx->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_mips64el(pTVar13,TCG_TYPE_I32,false);
    local_38 = tcg_temp_new_internal_mips64el(pTVar13,TCG_TYPE_I64,false);
    pTVar17 = (TCGv_i64)((long)local_38 - (long)pTVar13);
    pTVar4 = tcg_temp_new_internal_mips64el(pTVar13,TCG_TYPE_I64,false);
    tcg_gen_op2_mips64el(pTVar13,INDEX_op_movi_i32,(TCGArg)pTVar3,(ulong)(uVar7 >> 3));
    if (to == 0) {
      TVar11 = INDEX_op_movi_i64;
      pTVar15 = (TCGv_i64)0x0;
LAB_009870b8:
      tcg_gen_op2_mips64el(pTVar13,TVar11,(TCGArg)local_38,(TCGArg)pTVar15);
    }
    else if (pTVar13->cpu_gpr[to] != pTVar17) {
      pTVar15 = (TCGv_i64)((long)&pTVar13->pool_cur + (long)pTVar13->cpu_gpr[to]);
      TVar11 = INDEX_op_mov_i64;
      goto LAB_009870b8;
    }
    pTVar15 = (TCGv_i64)((long)pTVar4 - (long)pTVar13);
    if (from == 0) {
      tcg_gen_op2_mips64el(pTVar13,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
      switch(uVar16) {
      case 1:
        goto switchD_0098710a_caseD_1;
      case 2:
        goto switchD_0098710a_caseD_2;
      case 3:
        goto switchD_0098710a_caseD_3;
      }
switchD_0098710a_caseD_0:
      if ((ctx->hflags & 0x80000) == 0) {
        gen_pool32axf_nanomips_insn_cold_33();
      }
      local_50 = pTVar13->cpu_env + (long)pTVar13;
      pcVar12 = helper_maq_s_w_phr_mips64el;
    }
    else {
      if (pTVar13->cpu_gpr[a2] != pTVar15) {
        tcg_gen_op2_mips64el
                  (pTVar13,INDEX_op_mov_i64,(TCGArg)pTVar4,
                   (TCGArg)((long)&pTVar13->pool_cur + (long)pTVar13->cpu_gpr[a2]));
      }
      switch(uVar16) {
      case 0:
        goto switchD_0098710a_caseD_0;
      case 1:
switchD_0098710a_caseD_1:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_32();
        }
        local_50 = pTVar13->cpu_env + (long)pTVar13;
        pcVar12 = helper_maq_s_w_phl_mips64el;
        break;
      case 2:
switchD_0098710a_caseD_2:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_31();
        }
        local_50 = pTVar13->cpu_env + (long)pTVar13;
        pcVar12 = helper_maq_sa_w_phr_mips64el;
        break;
      case 3:
switchD_0098710a_caseD_3:
        if ((ctx->hflags & 0x80000) == 0) {
          gen_pool32axf_nanomips_insn_cold_30();
        }
        local_50 = pTVar13->cpu_env + (long)pTVar13;
        pcVar12 = helper_maq_sa_w_phl_mips64el;
      }
    }
    local_58 = (TCGTemp *)((long)pTVar13 + (long)pTVar17);
    local_60 = (TCGTemp *)((long)pTVar13 + (long)pTVar15);
    local_68 = (TCGTemp *)(((long)pTVar3 - (long)pTVar13) + (long)pTVar13);
    tcg_gen_callN_mips64el(pTVar13,pcVar12,(TCGTemp *)0x0,4,&local_68);
    tcg_temp_free_internal_mips64el
              (pTVar13,(TCGTemp *)(((long)pTVar3 - (long)pTVar13) + (long)pTVar13));
    tcg_temp_free_internal_mips64el(pTVar13,(TCGTemp *)(pTVar17 + (long)pTVar13));
    tcg_temp_free_internal_mips64el(pTVar13,(TCGTemp *)(pTVar15 + (long)pTVar13));
    break;
  case 7:
    if ((ctx->hflags & 0x80000) == 0) {
      gen_pool32axf_nanomips_insn_cold_29();
    }
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar7 >> 3));
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,a2);
    switch(ctx->opcode >> 0xc & 3) {
    case 0:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar12 = helper_extr_w_mips64el;
      break;
    case 1:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar12 = helper_extr_r_w_mips64el;
      break;
    case 2:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar12 = helper_extr_rs_w_mips64el;
      break;
    case 3:
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar12 = helper_extr_s_h_mips64el;
    }
    local_60 = (TCGTemp *)((long)s + lVar5);
    local_68 = (TCGTemp *)((long)s + (long)pTVar9);
    tcg_gen_callN_mips64el(s,pcVar12,local_68,3,&local_68);
joined_r0x00987761:
    if (to != 0) {
LAB_0098776a:
      pTVar17 = s->cpu_gpr[to];
LAB_00987772:
      if (pTVar17 != pTVar9) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar17),(TCGArg)pTVar3);
      }
    }
  }
LAB_00987908:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar9 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(lVar5 + (long)s));
LAB_0098792a:
  pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar10);
LAB_0098792d:
  tcg_temp_free_internal_mips64el(s,pTVar3);
  return;
}

Assistant:

static void gen_pool32axf_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 6, 3)) {
    case NM_POOL32AXF_1:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_1_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_2:
        {
            int32_t op1 = extract32(ctx->opcode, 12, 2);
            gen_pool32axf_2_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    case NM_POOL32AXF_4:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 7);
            gen_pool32axf_4_nanomips_insn(ctx, op1, rt, rs);
        }
        break;
    case NM_POOL32AXF_5:
        switch (extract32(ctx->opcode, 9, 7)) {
        case NM_TLBP:
            gen_cp0(env, ctx, OPC_TLBP, 0, 0);
            break;
        case NM_TLBR:
            gen_cp0(env, ctx, OPC_TLBR, 0, 0);
            break;
        case NM_TLBWI:
            gen_cp0(env, ctx, OPC_TLBWI, 0, 0);
            break;
        case NM_TLBWR:
            gen_cp0(env, ctx, OPC_TLBWR, 0, 0);
            break;
        case NM_TLBINV:
            gen_cp0(env, ctx, OPC_TLBINV, 0, 0);
            break;
        case NM_TLBINVF:
            gen_cp0(env, ctx, OPC_TLBINVF, 0, 0);
            break;
        case NM_DI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_di(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_EI:
            check_cp0_enabled(ctx);
            {
                TCGv t0 = tcg_temp_new(tcg_ctx);

                save_cpu_state(ctx, 1);
                gen_helper_ei(tcg_ctx, t0, tcg_ctx->cpu_env);
                gen_store_gpr(tcg_ctx, t0, rt);
            /* Stop translation as we may have switched the execution mode */
                ctx->base.is_jmp = DISAS_STOP;
                tcg_temp_free(tcg_ctx, t0);
            }
            break;
        case NM_RDPGPR:
            gen_load_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WRPGPR:
            gen_store_srsgpr(tcg_ctx, rs, rt);
            break;
        case NM_WAIT:
            gen_cp0(env, ctx, OPC_WAIT, 0, 0);
            break;
        case NM_DERET:
            gen_cp0(env, ctx, OPC_DERET, 0, 0);
            break;
        case NM_ERETX:
            gen_cp0(env, ctx, OPC_ERET, 0, 0);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_7:
        {
            int32_t op1 = extract32(ctx->opcode, 9, 3);
            gen_pool32axf_7_nanomips_insn(ctx, op1, rt, rs, rd);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}